

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall CVmObjDate::format_string_buf(CVmObjDate *this,char *buf,size_t buflen)

{
  CVmTimeZone *tz;
  char *tzabbr;
  int32_t tzofs;
  int32_t daytime;
  int32_t dayno;
  CVmDateLocale lc;
  gregcaldate_t date;
  
  tz = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
  tzabbr = get_local_time(this,&dayno,&daytime,&tzofs,tz);
  gregcaldate_t::gregcaldate_t(&date,dayno);
  CVmDateLocale::CVmDateLocale(&lc);
  format_date(this,buf,buflen,"%Y-%m-%d %H:%M:%S",0x11,&lc,&date.super_multicaldate_t,dayno,daytime,
              tzabbr,tzofs);
  return;
}

Assistant:

void CVmObjDate::format_string_buf(VMG_ char *buf, size_t buflen) const
{
    /* get the day number and time of day in local time */
    int32_t dayno, daytime, tzofs;
    const char *tzabbr = get_local_time(
        dayno, daytime, tzofs, G_tzcache->get_local_zone(vmg0_));

    /* convert the day number to a calendar date */
    gregcaldate_t date(dayno);

    /* format using a default template */
    CVmDateLocale lc Pvmg0_P;
    format_date(vmg_ buf, buflen, "%Y-%m-%d %H:%M:%S", 17, &lc,
                &date, dayno, daytime, tzabbr, tzofs);
}